

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.h
# Opt level: O0

bool ezy::detail::
     impl_empty<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>,ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>>const>,ezy::to_string_fn_const&>>
               (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[3]>,_ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[3]>_>_>,_const_ezy::to_string_fn_&>
                *t)

{
  bool bVar1;
  const_iterator local_68;
  const_iterator local_40;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[3]>,_ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[3]>_>_>,_const_ezy::to_string_fn_&>
  *local_18;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[3]>,_ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[3]>_>_>,_const_ezy::to_string_fn_&>
  *t_local;
  
  local_18 = t;
  std::
  begin<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>,ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>>const>,ezy::to_string_fn_const&>>
            (&local_40,t);
  std::
  end<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>,ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>>const>,ezy::to_string_fn_const&>>
            (&local_68,local_18);
  bVar1 = basic_iterator_adaptor<ezy::detail::iterator_concatenator<const_int[3],_const_int[3]>_>::
          operator!=(&local_40.
                      super_basic_iterator_adaptor<ezy::detail::iterator_concatenator<const_int[3],_const_int[3]>_>
                     ,&local_68.
                       super_basic_iterator_adaptor<ezy::detail::iterator_concatenator<const_int[3],_const_int[3]>_>
                    );
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

constexpr auto impl_empty(const T& t, priority_tag<0>) -> bool
    {
      using std::begin;
      using std::end;
      return !(begin(t) != end(t));
    }